

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::DateTimePickerPrivate::updateCurrentDateTime(DateTimePickerPrivate *this)

{
  int iVar1;
  Section *pSVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  long lVar6;
  int i;
  int iVar7;
  long lVar8;
  undefined8 local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  ulong local_58;
  int local_4c;
  QDateTime *local_48;
  QTime local_3c;
  QDate local_38;
  
  local_70 = QDateTime::date();
  local_68 = QDate::year();
  local_70 = QDateTime::date();
  iVar3 = QDate::month();
  uVar4 = QDateTime::time();
  local_70._0_4_ = uVar4;
  local_58 = QTime::hour();
  local_70._0_4_ = QDateTime::time();
  local_5c = QTime::minute();
  local_70._0_4_ = QDateTime::time();
  local_60 = QTime::second();
  uVar4 = QDateTime::time();
  local_70 = CONCAT44(local_70._4_4_,uVar4);
  local_4c = QTime::msec();
  local_48 = &this->minimum;
  iVar5 = -1;
  lVar6 = 0x28;
  lVar8 = 0;
  local_64 = -1;
  do {
    if ((this->super_DateTimeParser).sections.d.size <= lVar8) {
      iVar1 = 1;
      if (iVar5 != -1) {
        iVar1 = iVar5;
      }
      iVar5 = (int)local_58;
      if (local_64 == 0) {
        iVar7 = 0;
        if (iVar5 != 0xb) {
          iVar7 = iVar5 + 1;
        }
      }
      else {
        iVar7 = iVar5;
        if (local_64 == 1) {
          iVar7 = 0xc;
          if (iVar5 != 0xb) {
            iVar7 = iVar5 + 0xd;
          }
        }
      }
      QDate::QDate(&local_38,local_68,iVar3,iVar1);
      QTime::QTime(&local_3c,iVar7,local_5c,local_60,local_4c);
      QDateTime::QDateTime((QDateTime *)&local_70,local_38,local_3c,this->spec,0);
      setValue(this,(QDateTime *)&local_70,false);
      QDateTime::~QDateTime((QDateTime *)&local_70);
      return;
    }
    pSVar2 = (this->super_DateTimeParser).sections.d.ptr;
    iVar1 = *(int *)((long)pSVar2 + lVar6 + -0x28);
    switch(iVar1) {
    case 1:
      local_64 = *(int *)((long)&pSVar2->type + lVar6);
      break;
    case 2:
      local_60 = *(int *)((long)&pSVar2->type + lVar6);
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      local_5c = *(int *)((long)&pSVar2->type + lVar6);
      break;
    case 8:
switchD_0016b3ba_caseD_8:
      local_58 = (ulong)*(uint *)((long)&pSVar2->type + lVar6);
      break;
    default:
      if (iVar1 == 0x10) goto switchD_0016b3ba_caseD_8;
      if (((iVar1 == 0x20) || (iVar1 == 0x40)) || (iVar1 == 0x80)) {
        iVar5 = *(int *)((long)&pSVar2->type + lVar6) + 1;
      }
      else if (((iVar1 == 0x100) || (iVar1 == 0x200)) || (iVar1 == 0x400)) {
        iVar3 = *(int *)((long)&pSVar2->type + lVar6) + 1;
      }
      else if ((iVar1 == 0x800) || (iVar1 == 0x1000)) {
        local_70 = QDateTime::date();
        local_68 = QDate::year();
        local_68 = local_68 +
                   *(int *)((long)&((this->super_DateTimeParser).sections.d.ptr)->type + lVar6);
      }
    }
    lVar8 = lVar8 + 1;
    lVar6 = lVar6 + 0x30;
  } while( true );
}

Assistant:

void
DateTimePickerPrivate::updateCurrentDateTime()
{
	int year = value.date().year();
	int month = value.date().month();
	int day = -1;
	int hour = value.time().hour();
	int minute = value.time().minute();
	int second = value.time().second();
	int msecs = value.time().msec();
	int amPm = -1;

	for( int i = 0; i < sections.size(); ++i )
	{
		switch( sections.at( i ).type )
		{
			case Section::AmPmSection :
			{
				amPm = sections.at( i ).currentIndex;
			}
			break;

			case Section::SecondSection :
			{
				second = sections.at( i ).currentIndex;
			}
			break;

			case Section::MinuteSection :
			{
				minute = sections.at( i ).currentIndex;
			}
			break;

			case Section::Hour12Section :
			case Section::Hour24Section :
			{
				hour = sections.at( i ).currentIndex;
			}
			break;

			case Section::DaySection :
			case Section::DaySectionShort :
			case Section::DaySectionLong :
			{
				day = sections.at( i ).currentIndex + 1;
			}
			break;

			case Section::MonthSection :
			case Section::MonthSectionShort :
			case Section::MonthSectionLong :
			{
				month = sections.at( i ).currentIndex + 1;
			}
			break;

			case Section::YearSection :
			case Section::YearSection2Digits :
			{
				year = minimum.date().year() + sections.at( i ).currentIndex;
			}
			break;

			default:
				break;
		}
	}

	if( day == -1 )
		day = 1;

	if( amPm == 0 )
	{
		if( hour == 11 )
			hour = 0;
		else
			hour += 1;
	}
	else if( amPm == 1 )
	{
		if( hour == 11 )
			hour = 12;
		else
			hour += 12 + 1;
	}

	setValue( QDateTime( QDate( year, month, day ),
		QTime( hour, minute, second, msecs ), spec ), false );
}